

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimPatWrite(char *pFileName,Vec_Wrd_t *vSimsIn,int nWords)

{
  word *pwVar1;
  ulong uVar2;
  FILE *__stream;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  
  uVar2 = (long)vSimsIn->nSize / (long)nWords;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  if (vSimsIn->nSize % nWords == 0) {
    if (0 < (int)uVar2) {
      uVar7 = 1;
      if (1 < nWords * 0x10) {
        uVar7 = nWords * 0x10;
      }
      uVar4 = 0;
      do {
        lVar5 = uVar4 * (long)nWords;
        if ((lVar5 < 0) || (vSimsIn->nSize <= lVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < nWords) {
          pwVar1 = vSimsIn->pArray;
          bVar8 = 0;
          uVar6 = 0;
          do {
            uVar3 = (uint)(pwVar1[lVar5 + (uVar6 >> 4)] >> (bVar8 & 0x3c)) & 0xf;
            if (uVar3 < 10) {
              fprintf(__stream,"%d");
            }
            else {
              fputc(uVar3 + 0x37,__stream);
            }
            uVar3 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar3;
            bVar8 = bVar8 + 4;
          } while (uVar7 != uVar3);
        }
        fputc(10,__stream);
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uVar2 & 0xffffffff));
    }
    fclose(__stream);
    return;
  }
  __assert_fail("Vec_WrdSize(p) % nWords == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x4f6,"void Vec_WrdDumpHex(char *, Vec_Wrd_t *, int, int)");
}

Assistant:

void Gia_ManSimPatWrite( char * pFileName, Vec_Wrd_t * vSimsIn, int nWords )
{
    Vec_WrdDumpHex( pFileName, vSimsIn, nWords, 0 );
}